

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

bool __thiscall QWidgetPrivate::isFocusChainConsistent(QWidgetPrivate *this)

{
  bool bVar1;
  QWidget *pQVar2;
  QMessageLogger *this_00;
  char *file;
  QWidgetPrivate *pQVar3;
  QDebug *pQVar4;
  QWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  int i;
  QWidget *position;
  bool skip;
  QWidget *q;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_2;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QLoggingCategory *in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  int in_stack_fffffffffffffe54;
  int local_18c;
  QWidget *local_188;
  undefined7 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9f;
  QDebug local_140;
  QDebug in_stack_fffffffffffffec8;
  QDebug in_stack_fffffffffffffed0;
  QDebug local_128;
  QDebug local_120 [5];
  QDebug local_f8;
  QDebug local_f0;
  QDebug local_e8;
  QDebug local_e0;
  QDebug local_d8;
  QDebug local_d0;
  QDebug local_c8 [5];
  QDebug local_a0;
  QDebug local_98;
  QDebug local_90;
  QDebug local_88;
  QDebug local_80;
  QDebug local_78;
  QDebug local_70 [4];
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  QLoggingCategory local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = q_func(in_RDI);
  QLoggingCategory::QLoggingCategory(&local_20,"qt.widgets.focus",QtDebugMsg);
  bVar1 = QLoggingCategory::isDebugEnabled((QLoggingCategory *)0x382f28);
  QLoggingCategory::~QLoggingCategory(&local_20);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    bVar1 = isInFocusChain((QWidgetPrivate *)
                           CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
    if (bVar1) {
      local_18c = 0;
      local_188 = pQVar2;
      while( true ) {
        this_00 = (QMessageLogger *)(long)local_18c;
        QApplication::allWidgets();
        file = (char *)QList<QWidget_*>::count((QList<QWidget_*> *)0x382fa4);
        QList<QWidget_*>::~QList((QList<QWidget_*> *)0x382fb6);
        if ((long)file <= (long)this_00) break;
        pQVar3 = QWidget::d_func((QWidget *)0x382fd3);
        if (pQVar3->focus_prev == (QWidget *)0x0) {
LAB_00382ff5:
          local_30 = &DAT_aaaaaaaaaaaaaaaa;
          local_28 = &DAT_aaaaaaaaaaaaaaaa;
          lcWidgetFocus();
          anon_unknown.dwarf_2490c2::QLoggingCategoryMacroHolder<(QtMsgType)0>::
          QLoggingCategoryMacroHolder
                    ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
                     CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                     in_stack_fffffffffffffe48);
          while( true ) {
            bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                              ((QLoggingCategoryMacroHolder *)&local_30);
            if (!bVar1) break;
            anon_unknown.dwarf_2490c2::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                      ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x38304b);
            QMessageLogger::QMessageLogger
                      (this_00,file,in_stack_fffffffffffffe54,(char *)in_stack_fffffffffffffe48,
                       (char *)0x383064);
            QMessageLogger::debug();
            pQVar4 = QDebug::operator<<((QDebug *)in_RDI,
                                        (char *)CONCAT17(in_stack_fffffffffffffe9f,
                                                         in_stack_fffffffffffffe98));
            QDebug::QDebug(&local_98,pQVar4);
            ::operator<<((QDebug *)in_stack_fffffffffffffed0.stream,
                         (QWidget *)in_stack_fffffffffffffec8.stream);
            pQVar4 = QDebug::operator<<((QDebug *)in_RDI,
                                        (char *)CONCAT17(in_stack_fffffffffffffe9f,
                                                         in_stack_fffffffffffffe98));
            QDebug::QDebug(&local_88,pQVar4);
            QWidget::d_func((QWidget *)0x3830e5);
            ::operator<<((QDebug *)in_stack_fffffffffffffed0.stream,
                         (QWidget *)in_stack_fffffffffffffec8.stream);
            pQVar4 = QDebug::operator<<((QDebug *)in_RDI,
                                        (char *)CONCAT17(in_stack_fffffffffffffe9f,
                                                         in_stack_fffffffffffffe98));
            QDebug::QDebug(&local_78,pQVar4);
            QWidget::d_func((QWidget *)0x38312f);
            ::operator<<((QDebug *)in_stack_fffffffffffffed0.stream,
                         (QWidget *)in_stack_fffffffffffffec8.stream);
            QDebug::~QDebug(local_70);
            QDebug::~QDebug(&local_78);
            QDebug::~QDebug(&local_80);
            QDebug::~QDebug(&local_88);
            QDebug::~QDebug(&local_90);
            QDebug::~QDebug(&local_98);
            QDebug::~QDebug(&local_a0);
            local_28 = (undefined1 *)((ulong)local_28 & 0xffffffffffffff00);
          }
          bVar1 = false;
          goto LAB_0038357f;
        }
        pQVar3 = QWidget::d_func((QWidget *)0x382fe7);
        if (pQVar3->focus_next == (QWidget *)0x0) goto LAB_00382ff5;
        QWidget::d_func((QWidget *)0x3831c7);
        pQVar3 = QWidget::d_func((QWidget *)0x3831d3);
        if (pQVar3->focus_prev != local_188) {
LAB_00383209:
          local_40 = &DAT_aaaaaaaaaaaaaaaa;
          local_38 = &DAT_aaaaaaaaaaaaaaaa;
          lcWidgetFocus();
          anon_unknown.dwarf_2490c2::QLoggingCategoryMacroHolder<(QtMsgType)0>::
          QLoggingCategoryMacroHolder
                    ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
                     CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                     in_stack_fffffffffffffe48);
          while( true ) {
            bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                              ((QLoggingCategoryMacroHolder *)&local_40);
            if (!bVar1) break;
            anon_unknown.dwarf_2490c2::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                      ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x38325f);
            QMessageLogger::QMessageLogger
                      (this_00,file,in_stack_fffffffffffffe54,(char *)in_stack_fffffffffffffe48,
                       (char *)0x383278);
            QMessageLogger::debug();
            pQVar4 = QDebug::operator<<((QDebug *)in_RDI,
                                        (char *)CONCAT17(in_stack_fffffffffffffe9f,
                                                         in_stack_fffffffffffffe98));
            QDebug::QDebug(&local_f0,pQVar4);
            ::operator<<((QDebug *)in_stack_fffffffffffffed0.stream,
                         (QWidget *)in_stack_fffffffffffffec8.stream);
            pQVar4 = QDebug::operator<<((QDebug *)in_RDI,
                                        (char *)CONCAT17(in_stack_fffffffffffffe9f,
                                                         in_stack_fffffffffffffe98));
            QDebug::QDebug(&local_e0,pQVar4);
            QWidget::d_func((QWidget *)0x3832f9);
            QWidget::d_func((QWidget *)0x383305);
            ::operator<<((QDebug *)in_stack_fffffffffffffed0.stream,
                         (QWidget *)in_stack_fffffffffffffec8.stream);
            pQVar4 = QDebug::operator<<((QDebug *)in_RDI,
                                        (char *)CONCAT17(in_stack_fffffffffffffe9f,
                                                         in_stack_fffffffffffffe98));
            QDebug::QDebug(&local_d0,pQVar4);
            QWidget::d_func((QWidget *)0x38334f);
            QWidget::d_func((QWidget *)0x38335b);
            ::operator<<((QDebug *)in_stack_fffffffffffffed0.stream,
                         (QWidget *)in_stack_fffffffffffffec8.stream);
            QDebug::~QDebug(local_c8);
            QDebug::~QDebug(&local_d0);
            QDebug::~QDebug(&local_d8);
            QDebug::~QDebug(&local_e0);
            QDebug::~QDebug(&local_e8);
            QDebug::~QDebug(&local_f0);
            QDebug::~QDebug(&local_f8);
            local_38 = (undefined1 *)((ulong)local_38 & 0xffffffffffffff00);
          }
          bVar1 = false;
          goto LAB_0038357f;
        }
        QWidget::d_func((QWidget *)0x3831eb);
        pQVar3 = QWidget::d_func((QWidget *)0x3831f7);
        if (pQVar3->focus_next != local_188) goto LAB_00383209;
        pQVar3 = QWidget::d_func((QWidget *)0x3833f3);
        local_188 = pQVar3->focus_next;
        if (local_188 == pQVar2) {
          bVar1 = true;
          goto LAB_0038357f;
        }
        local_18c = local_18c + 1;
      }
      local_50 = &DAT_aaaaaaaaaaaaaaaa;
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      lcWidgetFocus();
      anon_unknown.dwarf_2490c2::QLoggingCategoryMacroHolder<(QtMsgType)0>::
      QLoggingCategoryMacroHolder
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
                 CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                 in_stack_fffffffffffffe48);
      while( true ) {
        bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                          ((QLoggingCategoryMacroHolder *)&local_50);
        if (!bVar1) break;
        anon_unknown.dwarf_2490c2::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x38347d);
        QMessageLogger::QMessageLogger
                  (this_00,file,in_stack_fffffffffffffe54,(char *)in_stack_fffffffffffffe48,
                   (char *)0x383493);
        QMessageLogger::debug();
        pQVar4 = QDebug::operator<<((QDebug *)in_RDI,
                                    (char *)CONCAT17(in_stack_fffffffffffffe9f,
                                                     in_stack_fffffffffffffe98));
        QDebug::QDebug((QDebug *)&stack0xfffffffffffffec8,pQVar4);
        ::operator<<((QDebug *)in_stack_fffffffffffffed0.stream,
                     (QWidget *)in_stack_fffffffffffffec8.stream);
        pQVar4 = QDebug::operator<<((QDebug *)in_RDI,
                                    (char *)CONCAT17(in_stack_fffffffffffffe9f,
                                                     in_stack_fffffffffffffe98));
        QDebug::QDebug(&local_128,pQVar4);
        ::operator<<((QDebug *)in_stack_fffffffffffffed0.stream,
                     (QWidget *)in_stack_fffffffffffffec8.stream);
        QDebug::operator<<((QDebug *)in_RDI,
                           (char *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
        QDebug::~QDebug(local_120);
        QDebug::~QDebug(&local_128);
        QDebug::~QDebug((QDebug *)&stack0xfffffffffffffed0);
        QDebug::~QDebug((QDebug *)&stack0xfffffffffffffec8);
        QDebug::~QDebug(&local_140);
        local_48 = (undefined1 *)((ulong)local_48 & 0xffffffffffffff00);
      }
      bVar1 = false;
    }
    else {
      bVar1 = true;
    }
  }
  else {
    bVar1 = true;
  }
LAB_0038357f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QWidgetPrivate::isFocusChainConsistent() const
{
    Q_Q(const QWidget);
    const bool skip = !QLoggingCategory("qt.widgets.focus").isDebugEnabled();
    if (skip)
        return true;

    if (!isInFocusChain())
        return true;

    const QWidget *position = q;

    for (int i = 0; i < QApplication::allWidgets().count(); ++i) {
        if (!FOCUS_PREV(position) || !FOCUS_NEXT(position)) {
            qCDebug(lcWidgetFocus) << "Nullptr found at:" << position
                             << "Previous pointing to" << FOCUS_PREV(position)
                             << "Next pointing to" << FOCUS_NEXT(position);
            return false;
        }
        if (!(FOCUS_PREV(FOCUS_NEXT(position)) == position
            && FOCUS_NEXT(FOCUS_PREV(position)) == position)) {
            qCDebug(lcWidgetFocus) << "Inconsistent focus chain at:" << position
                             << "Previous pointing to" << FOCUS_PREV(FOCUS_NEXT(position))
                             << "Next pointing to" << FOCUS_NEXT(FOCUS_PREV(position));
            return false;
        }
        position = FOCUS_NEXT(position);
        if (position == q)
            return true;

    }

    qCDebug(lcWidgetFocus) << "Focus chain leading from" << q << "to" << position << "is not closed.";
    return false;
}